

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq1_s(block_iq1_s *x,float *y,int64_t k)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  int ib;
  long lVar9;
  int l;
  long lVar10;
  
  lVar7 = 0;
  lVar5 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar5 = lVar7;
  }
  for (; lVar7 != lVar5; lVar7 = lVar7 + 1) {
    puVar8 = x[lVar7].qs;
    fVar1 = ggml_table_f32_f16[x[lVar7].d];
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      uVar4 = x[lVar7].qh[lVar9];
      fVar2 = *(float *)(&DAT_0014f6ec + (ulong)(-1 < (short)uVar4) * 4);
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        bVar3 = puVar8[lVar10];
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
          y[lVar6] = ((float)(int)*(char *)((long)iq1s_grid +
                                           (ulong)(((uVar4 >> ((char)lVar10 * '\x03' & 0x1fU) & 7)
                                                    << 8 | (uint)bVar3) << 3) + lVar6) + fVar2) *
                     (float)(ushort)((uVar4 >> 0xb & 0xe) + 1) * fVar1;
        }
        y = y + 8;
      }
      puVar8 = puVar8 + 4;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq1_s(const block_iq1_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t  * qs = x[i].qs;
        const uint16_t * qh = x[i].qh;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float dl = d * (2*((qh[ib] >> 12) & 7) + 1);
            const float delta = qh[ib] & 0x8000 ? -IQ1S_DELTA : IQ1S_DELTA;
            for (int l = 0; l < 4; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + (qs[l] | (((qh[ib] >> 3*l) & 7) << 8)));
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl * (grid[j] + delta);
                }
                y += 8;
            }
            qs += 4;
        }
    }
}